

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall toml::internal_error::~internal_error(internal_error *this)

{
  ~internal_error(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

virtual ~internal_error() noexcept override = default;